

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_content_chunked(Stream *strm,string *out)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  __ssize_t _Var4;
  int *piVar5;
  ulong uVar6;
  FILE *pFVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  FILE *in_RCX;
  FILE *__stream;
  size_t *in_RDX;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *psVar10;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *extraout_RDX_03;
  size_t *extraout_RDX_04;
  size_t *extraout_RDX_05;
  size_t *__n;
  size_t *extraout_RDX_06;
  size_t *extraout_RDX_07;
  size_t *extraout_RDX_08;
  bool bVar11;
  FILE *pFVar12;
  int iVar13;
  FILE *pFVar14;
  FILE *pFVar15;
  string chunk;
  stream_line_reader reader;
  char buf [16];
  allocator local_109;
  int *local_108;
  FILE *local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  FILE *local_e0;
  undefined1 local_d8 [16];
  char *local_c8;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  _IO_FILE *local_78;
  char *pcStack_70;
  code *local_68;
  code *pcStack_60;
  _IO_FILE *local_50;
  char local_48 [24];
  
  local_b8._0_8_ = local_b8 + 0x10;
  local_d8._8_8_ = local_48;
  local_c8 = (char *)0x10;
  local_b8._8_8_ = (char *)0x0;
  local_b8[0x10] = '\0';
  local_d8._0_8_ = strm;
  local_50 = (_IO_FILE *)out;
  _Var4 = stream_line_reader::getline((stream_line_reader *)local_d8,(char **)out,in_RDX,in_RCX);
  if ((char)_Var4 == '\0') goto LAB_00149e9e;
  __stream = (FILE *)(local_d8 + 8);
  pFVar12 = (FILE *)local_b8;
  if ((char *)local_b8._8_8_ == (char *)0x0) {
    pFVar12 = __stream;
  }
  std::__cxx11::string::string((string *)&local_100,*(char **)pFVar12,(allocator *)&local_e0);
  pFVar7 = local_100;
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  *piVar5 = 0;
  pFVar12 = (FILE *)local_98;
  uVar6 = strtol((char *)pFVar7,(char **)pFVar12,0x10);
  local_108 = piVar5;
  if ((FILE *)local_98._0_8_ == pFVar7) {
    std::__throw_invalid_argument("stoi");
LAB_00149ed7:
    std::__throw_out_of_range("stoi");
LAB_00149ee3:
    std::__throw_out_of_range("stoi");
LAB_00149eef:
    uVar9 = std::__throw_invalid_argument("stoi");
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
    _Unwind_Resume(uVar9);
  }
  if (((long)(int)uVar6 != uVar6) || (*piVar5 == 0x22)) goto LAB_00149ed7;
  if (*piVar5 == 0) {
    *piVar5 = iVar3;
  }
  psVar10 = extraout_RDX;
  if (local_100 != (FILE *)&local_f0) {
    pFVar12 = (FILE *)(CONCAT71(uStack_ef,local_f0) + 1);
    operator_delete(local_100,(ulong)pFVar12);
    psVar10 = extraout_RDX_00;
  }
  do {
    iVar3 = (int)uVar6;
    if (iVar3 < 1) goto LAB_00149e60;
    local_100 = (FILE *)&local_f0;
    local_f8 = 0;
    local_f0 = 0;
    pFVar15 = (FILE *)(uVar6 & 0xffffffff);
    local_78 = (_IO_FILE *)0x0;
    pcStack_70 = (char *)0x0;
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    pFVar12 = (FILE *)0x0;
    __stream = pFVar15;
    std::__cxx11::string::_M_replace_aux((ulong)&local_100,0,0,(char)pFVar15);
    pFVar7 = (FILE *)0x0;
    do {
      pFVar14 = pFVar7;
      psVar10 = (size_t *)((long)pFVar15 - (long)pFVar14);
      if (pFVar15 < pFVar14 || psVar10 == (size_t *)0x0) break;
      pFVar12 = (FILE *)((long)&pFVar14->_flags + (long)&local_100->_flags);
      uVar2 = (*strm->_vptr_Stream[2])(strm);
      psVar10 = extraout_RDX_01;
      if ((int)uVar2 < 1) {
        bVar11 = false;
        pFVar7 = pFVar14;
      }
      else {
        pFVar7 = (FILE *)((long)&pFVar14->_flags + (ulong)uVar2);
        if (local_68 != (code *)0x0) {
          pFVar12 = (FILE *)local_98;
          local_e0 = pFVar15;
          local_98._0_8_ = pFVar7;
          cVar1 = (*pcStack_60)((FILE *)&local_78,pFVar12,&local_e0);
          psVar10 = extraout_RDX_02;
          if (cVar1 == '\0') {
            bVar11 = false;
            goto LAB_00149ccf;
          }
        }
        bVar11 = true;
      }
LAB_00149ccf:
    } while (bVar11);
    if (local_68 != (code *)0x0) {
      pFVar12 = (FILE *)&local_78;
      (*local_68)((FILE *)&local_78,(FILE *)&local_78,3);
      psVar10 = extraout_RDX_03;
    }
    iVar13 = 1;
    if ((pFVar15 <= pFVar14) &&
       (_Var4 = stream_line_reader::getline
                          ((stream_line_reader *)local_d8,(char **)pFVar12,psVar10,__stream),
       psVar10 = extraout_RDX_04, (char)_Var4 != '\0')) {
      __stream = (FILE *)(local_d8 + 8);
      pFVar7 = (FILE *)local_b8;
      if ((char *)local_b8._8_8_ == (char *)0x0) {
        pFVar7 = __stream;
      }
      pFVar12 = (FILE *)0x15c5d8;
      iVar3 = strcmp(*(char **)pFVar7,"\r\n");
      if (iVar3 == 0) {
        pFVar12 = local_100;
        std::__cxx11::string::_M_append((char *)local_50,(ulong)local_100);
        _Var4 = stream_line_reader::getline
                          ((stream_line_reader *)local_d8,(char **)pFVar12,__n,__stream);
        psVar10 = extraout_RDX_06;
        if ((char)_Var4 != '\0') {
          puVar8 = (undefined8 *)local_b8;
          if ((char *)local_b8._8_8_ == (char *)0x0) {
            puVar8 = (undefined8 *)(local_d8 + 8);
          }
          std::__cxx11::string::string((string *)local_98,(char *)*puVar8,&local_109);
          uVar9 = local_98._0_8_;
          piVar5 = local_108;
          iVar3 = *local_108;
          *local_108 = 0;
          pFVar12 = (FILE *)&local_e0;
          uVar6 = strtol((char *)local_98._0_8_,(char **)pFVar12,0x10);
          if (local_e0 == (FILE *)uVar9) goto LAB_00149eef;
          __stream = (FILE *)(uVar6 - 0x80000000);
          psVar10 = (size_t *)0xffffffff00000000;
          if ((__stream < (FILE *)0xffffffff00000000) || (iVar13 = *piVar5, iVar13 == 0x22))
          goto LAB_00149ee3;
          if (iVar13 == 0) {
            *piVar5 = iVar3;
          }
          if ((FILE *)local_98._0_8_ != (FILE *)(local_98 + 0x10)) {
            pFVar12 = (FILE *)((long)(int *)local_98._16_8_ + 1);
            operator_delete((void *)local_98._0_8_,(ulong)pFVar12);
            psVar10 = extraout_RDX_07;
          }
          iVar13 = 0;
        }
      }
      else {
        iVar13 = 3;
        psVar10 = extraout_RDX_05;
      }
    }
    iVar3 = (int)uVar6;
    if (local_100 != (FILE *)&local_f0) {
      pFVar12 = (FILE *)(CONCAT71(uStack_ef,local_f0) + 1);
      operator_delete(local_100,(ulong)pFVar12);
      psVar10 = extraout_RDX_08;
    }
  } while (iVar13 == 0);
  if (iVar13 == 3) {
LAB_00149e60:
    if (iVar3 != 0) {
LAB_00149e65:
      bVar11 = true;
      goto LAB_00149ea0;
    }
    _Var4 = stream_line_reader::getline
                      ((stream_line_reader *)local_d8,(char **)pFVar12,psVar10,__stream);
    if ((char)_Var4 != '\0') {
      puVar8 = (undefined8 *)local_b8;
      if ((char *)local_b8._8_8_ == (char *)0x0) {
        puVar8 = (undefined8 *)(local_d8 + 8);
      }
      iVar3 = strcmp((char *)*puVar8,"\r\n");
      if (iVar3 == 0) goto LAB_00149e65;
    }
  }
LAB_00149e9e:
  bVar11 = false;
LAB_00149ea0:
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
  }
  return bVar11;
}

Assistant:

inline bool read_content_chunked(Stream& strm, std::string& out)
{
    const auto bufsiz = 16;
    char buf[bufsiz];

    stream_line_reader reader(strm, buf, bufsiz);

    if (!reader.getline()) {
        return false;
    }

    auto chunk_len = std::stoi(reader.ptr(), 0, 16);

    while (chunk_len > 0){
        std::string chunk;
        if (!read_content_with_length(strm, chunk, chunk_len, nullptr)) {
            return false;
        }

        if (!reader.getline()) {
            return false;
        }

        if (strcmp(reader.ptr(), "\r\n")) {
            break;
        }

        out += chunk;

        if (!reader.getline()) {
            return false;
        }

        chunk_len = std::stoi(reader.ptr(), 0, 16);
    }

    if (chunk_len == 0) {
        // Reader terminator after chunks
        if (!reader.getline() || strcmp(reader.ptr(), "\r\n"))
            return false;
    }

    return true;
}